

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  long *plVar1;
  Fts5Config *pFVar2;
  ushort *puVar3;
  long lVar4;
  Fts5Storage *pFVar5;
  Fts5StructureSegment *pFVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var13;
  char *pcVar14;
  i64 iDel;
  void *pvVar15;
  Fts5Structure *pFVar16;
  i64 iVar17;
  Fts5Structure *pFVar18;
  Fts5FullTable *pFVar19;
  Mem *pMVar20;
  u8 *puVar21;
  uchar *puVar22;
  Fts5Data *pFVar23;
  Fts5DlidxIter *pIter;
  ulong uVar24;
  uchar *puVar25;
  ulong uVar26;
  Fts5StructureLevel *pFVar27;
  sqlite3_module *psVar28;
  Fts5Index *pFVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  u32 uVar33;
  Mem *pMem;
  void *p;
  int iVar34;
  Fts5Storage *pFVar35;
  sqlite3_value *psVar36;
  sqlite3_stmt *psVar37;
  uint uVar38;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  int local_164;
  Fts5Storage *local_160;
  i64 nRow;
  undefined8 uStack_150;
  Fts5FullTable *local_148;
  Fts5Iter *local_140;
  Fts5Index *local_138;
  Fts5StructureSegment *local_130;
  int local_124;
  void *local_120;
  uchar *local_118;
  int nKeep;
  Fts5Buffer buf;
  Fts5Termset *pFStack_f0;
  i64 iPos;
  ulong uStack_d0;
  Fts5Structure *local_c8;
  sqlite3_stmt *pStmt;
  Fts5Buffer local_b8;
  u8 *local_a0;
  sqlite3_stmt *local_98;
  Fts5Data *local_90;
  ulong local_88;
  int local_7c;
  int local_78;
  int nTerm;
  u32 local_70;
  int nIncr;
  ulong local_68;
  Fts5StructureLevel *local_60;
  long local_58;
  Fts5StructureLevel *local_50;
  long local_48;
  i64 local_40;
  sqlite3_stmt *pScan;
  
  psVar28 = pVtab[1].pModule;
  local_164 = 0;
  psVar28->xSavepoint = (_func_int_sqlite3_vtab_ptr_int *)&pVtab->zErrMsg;
  for (p_Var13 = (pVtab[2].pModule)->xNext; p_Var13 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
      p_Var13 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var13 + 8)) {
    if ((*(int *)(p_Var13 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var13 == pVtab)) {
      p_Var13[0x50] = (_func_int_sqlite3_vtab_cursor_ptr)((byte)p_Var13[0x50] | 0x20);
    }
  }
  uVar32 = (uint)(*apVal)->flags;
  if (((0xaaaaaaaaU >> (uVar32 & 0x1f) & 1) == 0) ||
     (psVar36 = apVal[(long)*(int *)&psVar28->xBestIndex + 2], uVar38._0_2_ = psVar36->flags,
     uVar38._2_1_ = psVar36->enc, uVar38._3_1_ = psVar36->eSubtype,
     (0xaaaaaaaaU >> (uVar38 & 0x1f) & 1) != 0)) {
    uVar32 = uVar32 & 0x1f;
    if (*(int *)&psVar28->xFilter == 0) {
      bVar40 = *(char *)(*(long *)psVar28 + 0x66) == '\x05';
      bVar41 = (0x50505050U >> uVar32 & 1) != 0;
    }
    else {
      bVar41 = (0x50505050U >> uVar32 & 1) != 0;
      if (*(int *)&psVar28->xFilter == 1 && bVar41) {
        pcVar14 = "DELETE from";
        if (1 < nArg) {
          pcVar14 = "UPDATE";
        }
        pcVar14 = sqlite3_mprintf("cannot %s contentless fts5 table: %s",pcVar14,psVar28->xConnect);
        pVtab->zErrMsg = pcVar14;
        local_164 = 1;
        iVar8 = local_164;
        goto LAB_0019e080;
      }
      bVar40 = false;
    }
    if (nArg == 1) {
      iVar17 = sqlite3VdbeIntValue(*apVal);
      iVar8 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar17,(sqlite3_value **)0x0)
      ;
    }
    else {
      pMVar20 = apVal[1];
      uVar7 = pMVar20->flags;
      local_148 = (Fts5FullTable *)pVtab;
      if ((uVar7 & 0xf) == 2) {
        applyNumericAffinity(pMVar20,0);
        uVar7 = pMVar20->flags;
      }
      pVtab = (sqlite3_vtab *)local_148;
      if ((0xfafafafaU >> (uVar7 & 0x1f) & 1) == 0) {
        local_164 = 0x14;
        iVar8 = local_164;
      }
      else {
        uVar32 = uVar7 & 0x1f;
        if (bVar41) {
          iVar17 = sqlite3VdbeIntValue(*apVal);
          iDel = sqlite3VdbeIntValue(apVal[1]);
          pVtab = (sqlite3_vtab *)local_148;
          pFVar35 = local_148->pStorage;
          if (iVar17 == iDel || (0xafafafafUL >> (sbyte)uVar32 & 1) != 0) {
            local_164 = sqlite3Fts5StorageDelete(pFVar35,iVar17,(sqlite3_value **)0x0);
          }
          else {
            if (!bVar40) {
              local_164 = sqlite3Fts5StorageContentInsert(pFVar35,apVal,pRowid);
              iVar8 = local_164;
              if ((local_164 == 0) &&
                 (local_164 = sqlite3Fts5StorageDelete
                                        (((Fts5FullTable *)pVtab)->pStorage,iVar17,
                                         (sqlite3_value **)0x0), iVar8 = local_164, local_164 == 0))
              {
                iVar8 = sqlite3Fts5StorageIndexInsert
                                  (((Fts5FullTable *)pVtab)->pStorage,apVal,*pRowid);
              }
              goto LAB_0019e080;
            }
            local_164 = sqlite3Fts5StorageDelete(pFVar35,iVar17,(sqlite3_value **)0x0);
            if (local_164 == 0) {
              local_164 = sqlite3Fts5StorageDelete
                                    (((Fts5FullTable *)pVtab)->pStorage,iDel,(sqlite3_value **)0x0);
            }
          }
        }
        else if (bVar40 && (0x50505050U >> uVar32 & 1) != 0) {
          iVar17 = sqlite3VdbeIntValue(apVal[1]);
          local_164 = sqlite3Fts5StorageDelete
                                (((Fts5FullTable *)pVtab)->pStorage,iVar17,(sqlite3_value **)0x0);
        }
        fts5StorageInsert(&local_164,(Fts5FullTable *)pVtab,apVal,pRowid);
        iVar8 = local_164;
      }
    }
    goto LAB_0019e080;
  }
  pcVar14 = (char *)sqlite3ValueText(psVar36,'\x01');
  if (*(int *)&psVar28->xFilter == 0) {
    psVar36 = apVal[(long)*(int *)&psVar28->xBestIndex + 3];
    psVar28 = pVtab[1].pModule;
    local_124 = 0;
    if (pcVar14 != (char *)0x0) goto LAB_0019d9e7;
  }
  else {
    if (pcVar14 != (char *)0x0) {
      iVar8 = sqlite3StrICmp("delete",pcVar14);
      if (iVar8 == 0) {
        pMVar20 = apVal[1];
        uVar32._0_2_ = pMVar20->flags;
        uVar32._2_1_ = pMVar20->enc;
        uVar32._3_1_ = pMVar20->eSubtype;
        iVar8 = 0;
        if ((0x50505050U >> (uVar32 & 0x1f) & 1) != 0) {
          iVar17 = sqlite3VdbeIntValue(pMVar20);
          iVar8 = sqlite3Fts5StorageDelete((Fts5Storage *)pVtab[1].zErrMsg,iVar17,apVal + 2);
        }
        goto LAB_0019e080;
      }
      psVar36 = apVal[(long)*(int *)&psVar28->xBestIndex + 3];
      psVar28 = pVtab[1].pModule;
LAB_0019d9e7:
      local_124 = 0;
      iVar8 = sqlite3StrICmp("delete-all",pcVar14);
      if (iVar8 == 0) {
        if (*(int *)&psVar28->xFilter != 0) {
          iVar8 = sqlite3Fts5StorageDeleteAll((Fts5Storage *)pVtab[1].zErrMsg);
          goto LAB_0019e080;
        }
        pcVar14 = 
        "\'delete-all\' may only be used with a contentless or external content fts5 table";
      }
      else {
        iVar8 = sqlite3StrICmp("rebuild",pcVar14);
        if (iVar8 != 0) {
          iVar8 = sqlite3StrICmp("optimize",pcVar14);
          if (iVar8 == 0) {
            pFVar29 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
            fts5IndexFlush(pFVar29);
            pFVar16 = fts5StructureRead(pFVar29);
            if (pFVar29->pStruct != (Fts5Structure *)0x0) {
              fts5StructureRelease(pFVar29->pStruct);
              pFVar29->pStruct = (Fts5Structure *)0x0;
            }
            if (pFVar16 != (Fts5Structure *)0x0) {
              pFVar18 = fts5IndexOptimizeStruct(pFVar29,pFVar16);
              buf.p = (u8 *)pFVar18;
              fts5StructureRelease(pFVar16);
              if (pFVar18 != (Fts5Structure *)0x0) {
                iVar8 = -1;
                lVar31 = 0x1c;
                do {
                  lVar30 = lVar31;
                  iVar8 = iVar8 + 1;
                  lVar31 = lVar30 + 0x10;
                } while (*(int *)((long)pFVar18->aLevel + lVar30 + -0x18) == 0);
                local_148 = (Fts5FullTable *)pVtab;
                if (pFVar29->rc == 0) {
                  do {
                    pFVar18 = (Fts5Structure *)buf.p;
                    if (*(int *)(buf.p + lVar30) < 1) break;
                    nRow = CONCAT44(nRow._4_4_,1000);
                    fts5IndexMergeLevel(pFVar29,(Fts5Structure **)&buf,iVar8,(int *)&nRow);
                    pFVar18 = (Fts5Structure *)buf.p;
                  } while (pFVar29->rc == 0);
                }
                fts5StructureWrite(pFVar29,pFVar18);
                fts5StructureRelease(pFVar18);
                pVtab = (sqlite3_vtab *)local_148;
              }
            }
          }
          else {
            iVar8 = sqlite3StrICmp("merge",pcVar14);
            if (iVar8 != 0) {
              iVar8 = sqlite3StrICmp("integrity-check",pcVar14);
              if (iVar8 == 0) {
                pFVar35 = (Fts5Storage *)pVtab[1].zErrMsg;
                pFVar2 = pFVar35->pConfig;
                buf.p = (u8 *)0x0;
                buf.n = 0;
                buf.nSpace = 0;
                iVar12 = pFVar2->nCol;
                iVar9 = sqlite3_initialize();
                iVar8 = 7;
                if ((iVar9 == 0) &&
                   (pvVar15 = sqlite3Malloc((long)iVar12 * 0xc), pvVar15 != (void *)0x0)) {
                  iVar12 = pFVar2->nCol;
                  memset(pvVar15,0,(long)iVar12 * 8);
                  iVar8 = fts5StorageGetStmt(pFVar35,10,&pScan,(char **)0x0);
                  if (iVar8 == 0) {
                    iVar8 = sqlite3_step(pScan);
                    pFVar19 = (Fts5FullTable *)pScan;
                    local_160 = pFVar35;
                    if (iVar8 == 100) {
                      local_140 = (Fts5Iter *)((long)pvVar15 + (long)iVar12 * 8);
                      local_148 = (Fts5FullTable *)pScan;
                      local_120 = pvVar15;
                      do {
                        pFStack_f0 = (Fts5Termset *)0x0;
                        pMVar20 = columnMem((sqlite3_stmt *)pFVar19,0);
                        puVar21 = (u8 *)sqlite3VdbeIntValue(pMVar20);
                        columnMallocFailure((sqlite3_stmt *)pFVar19);
                        buf._8_8_ = buf._8_8_ & 0xffffffff;
                        buf.p = puVar21;
                        if ((pFVar2->bColumnsize != 0) &&
                           (iVar8 = sqlite3Fts5StorageDocsize(pFVar35,(i64)puVar21,(int *)local_140)
                           , iVar8 != 0)) {
LAB_0019ead7:
                          sqlite3Fts5TermsetFree(pFStack_f0);
                          sqlite3_reset((sqlite3_stmt *)local_148);
                          pvVar15 = local_120;
                          goto LAB_0019dade;
                        }
                        if (pFVar2->eDetail == 1) {
                          nRow = nRow & 0xffffffff00000000;
                          pFStack_f0 = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000);
                          iVar8 = (int)nRow;
                          if ((int)nRow != 0) goto LAB_0019ead7;
                        }
                        uVar39 = 0;
                        while ((long)uVar39 < (long)pFVar2->nCol) {
                          iVar8 = 0;
                          if (pFVar2->abUnindexed[uVar39] == '\0') {
                            buf._8_8_ = uVar39 & 0xffffffff;
                            if (pFVar2->eDetail == 2) {
                              nRow = nRow & 0xffffffff00000000;
                              pFStack_f0 = (Fts5Termset *)sqlite3Fts5MallocZero((int *)&nRow,0x1000)
                              ;
                              iVar8 = (int)nRow;
                              if ((int)nRow == 0) goto LAB_0019e1c1;
                            }
                            else {
LAB_0019e1c1:
                              pFVar19 = local_148;
                              iVar8 = (int)uVar39 + 1;
                              puVar22 = sqlite3_column_text((sqlite3_stmt *)local_148,iVar8);
                              pFVar35 = local_160;
                              iVar8 = sqlite3_column_bytes((sqlite3_stmt *)pFVar19,iVar8);
                              if ((puVar22 == (uchar *)0x0) ||
                                 (iVar8 = (*pFVar2->pTokApi->xTokenize)
                                                    (pFVar2->pTok,&buf,4,(char *)puVar22,iVar8,
                                                     fts5StorageIntegrityCallback), iVar8 == 0)) {
                                if (pFVar2->bColumnsize == 0) {
                                  iVar8 = 0;
                                }
                                else {
                                  iVar8 = 0x10b;
                                  if (buf.nSpace ==
                                      *(int *)((long)local_140->aSeg + uVar39 * 4 + -0x60)) {
                                    iVar8 = 0;
                                  }
                                }
                              }
                            }
                            plVar1 = (long *)((long)local_120 + uVar39 * 8);
                            *plVar1 = *plVar1 + (long)buf.nSpace;
                            if (pFVar2->eDetail == 2) {
                              sqlite3Fts5TermsetFree(pFStack_f0);
                              pFStack_f0 = (Fts5Termset *)0x0;
                            }
                          }
                          uVar39 = uVar39 + 1;
                          if (iVar8 != 0) goto LAB_0019ead7;
                        }
                        sqlite3Fts5TermsetFree(pFStack_f0);
                        pFVar19 = local_148;
                        iVar8 = sqlite3_step((sqlite3_stmt *)local_148);
                        pvVar15 = local_120;
                      } while (iVar8 == 100);
                    }
                    iVar8 = sqlite3_reset((sqlite3_stmt *)pFVar19);
                    if (iVar8 == 0) {
                      iVar8 = fts5StorageLoadTotals(pFVar35,0);
                      if (iVar8 == 0) {
                        uVar39 = (ulong)(uint)pFVar2->nCol;
                        if (pFVar2->nCol < 1) {
                          uVar39 = 0;
                        }
                        iVar8 = 0x10b;
                        uVar24 = 0;
LAB_0019e2de:
                        if (uVar39 != uVar24) goto code_r0x0019e2e3;
                        local_148 = (Fts5FullTable *)pVtab;
                        local_120 = pvVar15;
                        if (pFVar2->eContent == 0) {
                          nRow = 0;
                          iVar8 = fts5StorageCount((Fts5Storage *)local_160->pConfig,"content",&nRow
                                                  );
                          pVtab = (sqlite3_vtab *)local_148;
                          pvVar15 = local_120;
                          if ((iVar8 != 0) || (iVar8 = 0x10b, nRow != local_160->nTotalRow))
                          goto LAB_0019dade;
                        }
                        if (pFVar2->bColumnsize != 0) {
                          nRow = 0;
                          iVar8 = fts5StorageCount((Fts5Storage *)local_160->pConfig,"docsize",&nRow
                                                  );
                          pVtab = (sqlite3_vtab *)local_148;
                          pvVar15 = local_120;
                          if ((iVar8 != 0) || (iVar8 = 0x10b, nRow != local_160->nTotalRow))
                          goto LAB_0019dade;
                        }
                        local_138 = local_160->pIndex;
                        local_68 = 0;
                        local_7c = local_138->pConfig->eDetail;
                        local_b8.p = (u8 *)0x0;
                        local_b8.n = 0;
                        local_b8.nSpace = 0;
                        local_c8 = fts5StructureRead(local_138);
                        if (local_c8 == (Fts5Structure *)0x0) {
                          pFVar16 = (Fts5Structure *)0x0;
                        }
                        else {
                          iVar8 = local_c8->nLevel;
                          pFVar16 = local_c8;
                          if (0 < iVar8) {
                            pFVar27 = local_c8->aLevel;
                            local_160 = (Fts5Storage *)&local_138->rc;
                            lVar31 = 0;
                            local_60 = pFVar27;
                            do {
                              if (0 < pFVar27[lVar31].nSeg) {
                                pFVar27 = pFVar27 + lVar31;
                                lVar30 = 0;
                                pFVar29 = local_138;
                                pFVar35 = local_160;
                                local_58 = lVar31;
                                local_50 = pFVar27;
                                do {
                                  pStmt = (sqlite3_stmt *)0x0;
                                  iVar8 = pFVar27->aSeg[lVar30].pgnoFirst;
                                  local_140 = (Fts5Iter *)CONCAT44(local_140._4_4_,iVar8);
                                  if (iVar8 != 0) {
                                    local_130 = pFVar27->aSeg + lVar30;
                                    uVar39 = (ulong)(uint)local_130->pgnoLast;
                                    local_48 = lVar30;
                                    pcVar14 = sqlite3_mprintf(
                                                  "SELECT segid, term, (pgno>>1), (pgno&1) FROM %Q.\'%q_idx\' WHERE segid=%d"
                                                  ,pFVar29->pConfig->zDb,pFVar29->pConfig->zName,
                                                  (ulong)(uint)local_130->iSegid);
                                    fts5IndexPrepareStmt(pFVar29,&pStmt,pcVar14);
                                    psVar37 = pStmt;
                                    if (pFVar29->rc == 0) {
                                      local_140 = (Fts5Iter *)
                                                  CONCAT44(local_140._4_4_,(int)local_140 + -1);
                                      local_98 = pStmt;
                                      do {
                                        iVar8 = sqlite3_step(psVar37);
                                        if (iVar8 != 100) break;
                                        iVar8 = sqlite3_column_bytes(psVar37,1);
                                        local_118 = sqlite3_column_text(psVar37,1);
                                        pMVar20 = columnMem(psVar37,2);
                                        uVar24 = sqlite3VdbeIntValue(pMVar20);
                                        columnMallocFailure(psVar37);
                                        pMVar20 = columnMem(psVar37,3);
                                        local_40 = sqlite3VdbeIntValue(pMVar20);
                                        columnMallocFailure(psVar37);
                                        if ((int)uVar24 < local_130->pgnoFirst) {
                                          iVar8 = (int)local_140;
                                        }
                                        else {
                                          pFVar23 = fts5LeafRead(pFVar29,(long)(int)uVar24 +
                                                                         ((ulong)(uint)local_130->
                                                                                       iSegid <<
                                                                         0x25));
                                          if (pFVar23 == (Fts5Data *)0x0) break;
                                          iVar12 = pFVar23->szLeaf;
                                          local_88 = uVar24;
                                          if (iVar12 < pFVar23->nn) {
                                            puVar3 = (ushort *)pFVar23->p;
                                            local_90 = pFVar23;
                                            sqlite3Fts5GetVarint32
                                                      ((uchar *)((long)puVar3 + (long)iVar12),
                                                       (u32 *)&nRow);
                                            iVar9 = (int)nRow;
                                            if (((int)nRow < iVar12) &&
                                               ((int)(uint)(ushort)(*puVar3 << 8 | *puVar3 >> 8) <
                                                (int)nRow)) {
                                              iVar10 = sqlite3Fts5GetVarint32
                                                                 ((uchar *)((long)puVar3 +
                                                                           (nRow & 0xffffffffU)),
                                                                  (u32 *)&nTerm);
                                              iVar34 = nTerm - iVar8;
                                              iVar11 = nTerm;
                                              if (iVar8 <= nTerm) {
                                                iVar11 = iVar8;
                                              }
                                              if ((iVar11 != 0) &&
                                                 (iVar8 = memcmp((void *)((long)puVar3 +
                                                                         (ulong)(uint)(iVar10 + 
                                                  iVar9)),local_118,(long)iVar11), iVar8 != 0)) {
                                                iVar34 = iVar8;
                                              }
                                              if (iVar34 < 0) goto LAB_0019e844;
                                              nRow = 0;
                                              uStack_150 = 0;
                                              iPos = 0;
                                              uStack_d0 = 0;
                                              if (*(int *)&local_160->pConfig != 0)
                                              goto LAB_0019e851;
                                              puVar22 = (uchar *)0x0;
                                              uVar33 = 0;
                                              do {
                                                local_a0 = local_90->p;
                                                iVar9 = sqlite3Fts5GetVarint32
                                                                  (local_a0 + iVar12,(u32 *)&nIncr);
                                                puVar21 = local_a0;
                                                puVar25 = (uchar *)((long)(int)puVar22 + (long)nIncr
                                                                   );
                                                iVar8 = local_90->szLeaf;
                                                iVar34 = (int)puVar25;
                                                local_118 = puVar25;
                                                if (iVar34 < iVar8) {
                                                  if ((int)puVar22 == 0) {
                                                    iVar11 = sqlite3Fts5GetVarint32
                                                                       (puVar25 + (long)local_a0,
                                                                        (u32 *)&nKeep);
                                                    pFVar35 = local_160;
                                                    if (iVar8 < iVar11 + iVar34 + nKeep) {
                                                      *(undefined4 *)&local_160->pConfig = 0x10b;
                                                      puVar22 = puVar25;
                                                    }
                                                    else {
                                                      uStack_150 = uStack_150 & 0xffffffff00000000;
                                                      sqlite3Fts5BufferAppendBlob
                                                                ((int *)local_160,
                                                                 (Fts5Buffer *)&nRow,nKeep,
                                                                 puVar21 + (iVar11 + iVar34));
                                                      puVar22 = puVar25;
                                                    }
                                                  }
                                                  else {
                                                    local_78 = iVar9;
                                                    iVar9 = sqlite3Fts5GetVarint32
                                                                      (local_a0 + iVar34,
                                                                       (u32 *)&nKeep);
                                                    iVar11 = sqlite3Fts5GetVarint32
                                                                       (local_a0 + (iVar9 + iVar34),
                                                                        &local_70);
                                                    pFVar5 = local_160;
                                                    if (((int)uVar33 < nKeep) ||
                                                       (iVar11 = iVar9 + iVar34 + iVar11,
                                                       iVar8 < (int)(local_70 + iVar11))) {
LAB_0019e6de:
                                                      *(undefined4 *)&local_160->pConfig = 0x10b;
                                                      puVar22 = puVar25;
                                                      pFVar35 = local_160;
                                                      iVar9 = local_78;
                                                    }
                                                    else {
                                                      uStack_150 = CONCAT44(uStack_150._4_4_,nKeep);
                                                      sqlite3Fts5BufferAppendBlob
                                                                ((int *)local_160,
                                                                 (Fts5Buffer *)&nRow,local_70,
                                                                 local_a0 + iVar11);
                                                      puVar22 = local_118;
                                                      pFVar35 = local_160;
                                                      iVar9 = local_78;
                                                      if (*(int *)&pFVar5->pConfig == 0) {
                                                        iVar9 = (u32)uStack_150 - (int)uStack_d0;
                                                        iVar8 = (int)uStack_d0;
                                                        if ((int)(u32)uStack_150 < (int)uStack_d0) {
                                                          iVar8 = (u32)uStack_150;
                                                        }
                                                        if ((iVar8 == 0) ||
                                                           (iVar8 = memcmp((void *)nRow,(void *)iPos
                                                                           ,(long)iVar8), iVar8 == 0
                                                           )) {
                                                          iVar8 = iVar9;
                                                        }
                                                        puVar25 = local_118;
                                                        puVar22 = local_118;
                                                        pFVar35 = local_160;
                                                        iVar9 = local_78;
                                                        if (iVar8 < 1) goto LAB_0019e6de;
                                                      }
                                                    }
                                                  }
                                                }
                                                else {
                                                  *(undefined4 *)&local_160->pConfig = 0x10b;
                                                  puVar22 = puVar25;
                                                  pFVar35 = local_160;
                                                }
                                                pvVar15 = (void *)nRow;
                                                iVar12 = iVar12 + iVar9;
                                                uVar33 = (u32)uStack_150;
                                                uStack_d0 = uStack_d0 & 0xffffffff00000000;
                                                sqlite3Fts5BufferAppendBlob
                                                          ((int *)pFVar35,(Fts5Buffer *)&iPos,
                                                           (u32)uStack_150,(u8 *)nRow);
                                                p = (void *)iPos;
                                              } while ((iVar12 < local_90->nn) &&
                                                      (*(int *)&pFVar35->pConfig == 0));
                                            }
                                            else {
LAB_0019e844:
                                              *(undefined4 *)&local_160->pConfig = 0x10b;
LAB_0019e851:
                                              pvVar15 = (void *)0x0;
                                              p = (void *)0x0;
                                              pFVar35 = local_160;
                                            }
                                            sqlite3_free(pvVar15);
                                            sqlite3_free(p);
                                            pFVar23 = local_90;
                                            pFVar29 = local_138;
                                          }
                                          else {
                                            *(undefined4 *)&pFVar35->pConfig = 0x10b;
                                          }
                                          uVar24 = local_88;
                                          psVar37 = local_98;
                                          sqlite3_free(pFVar23);
                                          pFVar6 = local_130;
                                          if (*(int *)&pFVar35->pConfig != 0) break;
                                          iVar8 = (int)uVar24 + -1;
                                          if ((int)local_140 < iVar8) {
                                            lVar31 = (long)((int)local_140 + 1);
                                            do {
                                              pFVar23 = fts5DataRead(pFVar29,((ulong)(uint)pFVar6->
                                                  iSegid << 0x25) + lVar31);
                                              if (pFVar23 != (Fts5Data *)0x0) {
                                                if (pFVar23->szLeaf < pFVar23->nn) {
                                                  *(undefined4 *)&pFVar35->pConfig = 0x10b;
                                                }
                                                if (((int)uVar39 + 1 <= lVar31) &&
                                                   (pFVar23->p[1] != '\0' || *pFVar23->p != '\0')) {
                                                  *(undefined4 *)&pFVar35->pConfig = 0x10b;
                                                }
                                              }
                                              sqlite3_free(pFVar23);
                                            } while ((lVar31 < iVar8) &&
                                                    (lVar31 = lVar31 + 1,
                                                    *(int *)&pFVar35->pConfig == 0));
                                            uVar24 = local_88;
                                            psVar37 = local_98;
                                            if (*(int *)&pFVar35->pConfig != 0) break;
                                          }
                                          iVar8 = (int)uVar24;
                                          if ((int)local_40 == 0) {
                                            uVar39 = (ulong)(uint)local_130->pgnoLast;
                                          }
                                          else {
                                            uVar32 = local_130->iSegid;
                                            uVar39 = 0;
                                            pIter = fts5DlidxIterInit(pFVar29,0,uVar32,iVar8);
                                            if ((pFVar29->rc == 0) && (pIter->aLvl[0].bEof == 0)) {
                                              lVar31 = (ulong)uVar32 << 0x25;
                                              uVar24 = uVar24 & 0xffffffff;
                                              do {
                                                uVar38 = (int)uVar24 + 1;
                                                uVar39 = (ulong)uVar38;
                                                uVar32 = pIter->aLvl[0].iLeafPgno;
                                                if ((int)uVar38 < (int)uVar32) {
                                                  uVar39 = (ulong)(int)uVar38;
                                                  do {
                                                    pFVar23 = fts5DataRead(pFVar29,lVar31 + uVar39);
                                                    if (pFVar23 != (Fts5Data *)0x0) {
                                                      if (pFVar23->p[1] != '\0' ||
                                                          *pFVar23->p != '\0') {
                                                        *(undefined4 *)&local_160->pConfig = 0x10b;
                                                      }
                                                      sqlite3_free(pFVar23);
                                                    }
                                                    uVar39 = uVar39 + 1;
                                                    uVar32 = pIter->aLvl[0].iLeafPgno;
                                                    lVar30 = (long)(int)uVar32;
                                                  } while ((long)uVar39 < lVar30);
                                                }
                                                else {
                                                  lVar30 = (long)(int)uVar32;
                                                }
                                                uVar24 = (ulong)uVar32;
                                                pFVar23 = fts5DataRead(pFVar29,lVar30 + lVar31);
                                                if (pFVar23 != (Fts5Data *)0x0) {
                                                  uVar7 = *(ushort *)pFVar23->p;
                                                  uVar7 = uVar7 << 8 | uVar7 >> 8;
                                                  if ((pFVar23->szLeaf <= (int)(uint)uVar7) ||
                                                     (sqlite3Fts5GetVarint
                                                                ((uchar *)((long)pFVar23->p +
                                                                          (ulong)uVar7),(u64 *)&nRow
                                                                ), nRow != pIter->aLvl[0].iRowid)) {
                                                    *(undefined4 *)&local_160->pConfig = 0x10b;
                                                  }
                                                  sqlite3_free(pFVar23);
                                                }
                                                fts5DlidxIterNextR(pFVar29,pIter,0);
                                                iVar8 = (int)local_88;
                                              } while ((pFVar29->rc == 0) &&
                                                      (pIter->aLvl[0].bEof == 0));
                                            }
                                            fts5DlidxIterFree(pIter);
                                            pFVar35 = local_160;
                                            psVar37 = local_98;
                                          }
                                        }
                                        local_140 = (Fts5Iter *)CONCAT44(local_140._4_4_,iVar8);
                                      } while (*(int *)&pFVar35->pConfig == 0);
                                    }
                                    iVar8 = sqlite3_finalize(psVar37);
                                    lVar30 = local_48;
                                    pFVar27 = local_50;
                                    if (*(int *)&pFVar35->pConfig == 0) {
                                      *(int *)&pFVar35->pConfig = iVar8;
                                    }
                                  }
                                  lVar30 = lVar30 + 1;
                                } while (lVar30 < pFVar27->nSeg);
                                iVar8 = local_c8->nLevel;
                                pFVar27 = local_60;
                                lVar31 = local_58;
                              }
                              lVar31 = lVar31 + 1;
                              pFVar16 = local_c8;
                            } while (lVar31 < iVar8);
                          }
                        }
                        fts5MultiIterNew(local_138,pFVar16,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,-1,0,
                                         (Fts5Iter **)&nRow);
                        local_140 = (Fts5Iter *)nRow;
                        if (local_138->rc == 0) {
                          local_130 = (Fts5StructureSegment *)(nRow + 0x60);
                          uVar39 = 0;
                          do {
                            if ((local_140->base).bEof != '\0') break;
                            iPos = 0;
                            pStmt = (sqlite3_stmt *)((ulong)pStmt & 0xffffffff00000000);
                            uVar24 = (ulong)local_140->aFirst[1].iFirst;
                            lVar31 = *(long *)&local_130[uVar24 * 10 + 8].pgnoLast;
                            uVar32 = local_130[uVar24 * 10 + 8].iSegid;
                            lVar30 = *(long *)&local_130[uVar24 * 10 + 7].pgnoFirst;
                            if (local_7c == 1) {
                              lVar4._0_4_ = local_130[uVar24 * 10 + 1].pgnoFirst;
                              lVar4._4_4_ = local_130[uVar24 * 10 + 1].pgnoLast;
                              if ((lVar4 == 0) || (local_130[uVar24 * 10 + 9].pgnoFirst != 0)) {
                                uVar24 = lVar31 * 0x51;
                                if (0 < (int)uVar32) {
                                  uVar26 = 0;
                                  do {
                                    uVar24 = uVar24 * 9 + (long)*(char *)(lVar30 + uVar26);
                                    uVar26 = uVar26 + 1;
                                  } while (uVar32 != uVar26);
                                }
                                uVar39 = uVar39 ^ uVar24;
                              }
                            }
                            else {
                              local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
                              fts5SegiterPoslist(local_138,(Fts5SegIter *)(local_130 + uVar24 * 10),
                                                 (Fts5Colset *)0x0,&local_b8);
                              iVar8 = local_b8.n;
                              local_160 = (Fts5Storage *)local_b8.p;
                              iVar12 = sqlite3Fts5PoslistNext64
                                                 (local_b8.p,local_b8.n,(int *)&pStmt,&iPos);
                              if (iVar12 == 0) {
                                do {
                                  uVar24 = (ulong)((uint)iPos & 0x7fffffff) +
                                           ((iPos >> 0x20) + lVar31 * 9) * 9;
                                  if (0 < (int)uVar32) {
                                    uVar26 = 0;
                                    do {
                                      uVar24 = uVar24 * 9 + (long)*(char *)(lVar30 + uVar26);
                                      uVar26 = uVar26 + 1;
                                    } while (uVar32 != uVar26);
                                  }
                                  uVar39 = uVar39 ^ uVar24;
                                  iVar12 = sqlite3Fts5PoslistNext64
                                                     ((u8 *)local_160,iVar8,(int *)&pStmt,&iPos);
                                } while (iVar12 == 0);
                              }
                            }
                            pFVar29 = local_138;
                            fts5MultiIterNext(local_138,local_140,0,0);
                          } while (pFVar29->rc == 0);
                        }
                        else {
                          uVar39 = 0;
                        }
                        fts5MultiIterFree(local_140);
                        if ((local_138->rc == 0) && (uVar39 != local_68)) {
                          local_138->rc = 0x10b;
                        }
                        fts5StructureRelease(local_c8);
                        sqlite3_free(local_b8.p);
                        iVar8 = local_138->rc;
                        local_138->rc = 0;
                        pVtab = (sqlite3_vtab *)local_148;
                        pvVar15 = local_120;
                      }
                    }
                  }
LAB_0019dade:
                  sqlite3_free(pvVar15);
                }
                goto LAB_0019e080;
              }
              goto LAB_0019db48;
            }
            iVar17 = sqlite3VdbeIntValue(psVar36);
            iVar8 = (int)iVar17;
            pFVar29 = *(Fts5Index **)(pVtab[1].zErrMsg + 8);
            pFVar16 = fts5StructureRead(pFVar29);
            if (pFVar16 == (Fts5Structure *)0x0) goto LAB_0019e070;
            iVar12 = pFVar29->pConfig->nUsermerge;
            buf.p = (u8 *)pFVar16;
            if (pFVar29->pStruct != (Fts5Structure *)0x0) {
              fts5StructureRelease(pFVar29->pStruct);
              pFVar29->pStruct = (Fts5Structure *)0x0;
            }
            if (iVar8 < 0) {
              pFVar18 = fts5IndexOptimizeStruct(pFVar29,pFVar16);
              fts5StructureRelease(pFVar16);
              buf.p = (u8 *)pFVar18;
              if (pFVar18 != (Fts5Structure *)0x0) {
                iVar8 = -iVar8;
                iVar12 = 2;
                pFVar16 = pFVar18;
                goto LAB_0019de65;
              }
              pFVar16 = (Fts5Structure *)0x0;
            }
            else {
LAB_0019de65:
              if ((pFVar16->nLevel != 0) &&
                 (iVar8 = fts5IndexMerge(pFVar29,(Fts5Structure **)&buf,iVar8,iVar12),
                 pFVar16 = (Fts5Structure *)buf.p, iVar8 != 0)) {
                fts5StructureWrite(pFVar29,(Fts5Structure *)buf.p);
              }
            }
            fts5StructureRelease(pFVar16);
          }
LAB_0019e070:
          iVar8 = pFVar29->rc;
          pFVar29->rc = 0;
          goto LAB_0019e080;
        }
        if (*(int *)&psVar28->xFilter != 1) {
          pFVar35 = (Fts5Storage *)pVtab[1].zErrMsg;
          buf.p = (u8 *)0x0;
          buf.n = 0;
          buf.nSpace = 0;
          pFVar2 = pFVar35->pConfig;
          iPos = 0;
          uStack_150 = 0;
          nRow = (i64)pFVar35;
          iVar12 = sqlite3Fts5StorageDeleteAll(pFVar35);
          if ((iVar12 == 0) && (iVar12 = fts5StorageLoadTotals(pFVar35,1), iVar12 == 0)) {
            iVar12 = fts5StorageGetStmt(pFVar35,10,(sqlite3_stmt **)&iPos,(char **)0x0);
            psVar37 = (sqlite3_stmt *)iPos;
            if (iVar12 == 0) {
              do {
                iVar8 = sqlite3_step(psVar37);
                bVar41 = iVar8 != 100;
                if (bVar41) {
                  iVar12 = 0;
                  bVar41 = true;
                  puVar21 = buf.p;
                  break;
                }
                pMVar20 = columnMem(psVar37,0);
                pFVar19 = (Fts5FullTable *)sqlite3VdbeIntValue(pMVar20);
                columnMallocFailure(psVar37);
                buf._8_8_ = buf._8_8_ & 0xffffffff00000000;
                local_148 = pFVar19;
                iVar12 = sqlite3Fts5IndexBeginWrite(pFVar35->pIndex,0,(i64)pFVar19);
                local_b8.p = (u8 *)CONCAT44(local_b8.p._4_4_,iVar12);
                uStack_150 = uStack_150 & 0xffffffff00000000;
                if (iVar12 != 0) {
LAB_0019e0a5:
                  pFVar35->nTotalRow = pFVar35->nTotalRow + 1;
                  bVar41 = false;
                  puVar21 = buf.p;
                  break;
                }
                iVar8 = 0;
                while (iVar8 < pFVar2->nCol) {
                  uStack_150 = uStack_150 & 0xffffffff;
                  if (pFVar2->abUnindexed[iVar8] == '\0') {
                    puVar22 = sqlite3_column_text(psVar37,iVar8 + 1);
                    iVar8 = sqlite3_column_bytes(psVar37,(u32)uStack_150 + 1);
                    if (puVar22 == (uchar *)0x0) {
                      iVar8 = 0;
                    }
                    else {
                      iVar8 = (*pFVar2->pTokApi->xTokenize)
                                        (pFVar2->pTok,&nRow,4,(char *)puVar22,iVar8,
                                         fts5StorageInsertCallback);
                    }
                    local_b8.p = (u8 *)CONCAT44(local_b8.p._4_4_,iVar8);
                    iVar17 = (i64)uStack_150._4_4_;
                  }
                  else {
                    iVar17 = 0;
                  }
                  sqlite3Fts5BufferAppendVarint((int *)&local_b8,&buf,iVar17);
                  pFVar35->aTotalSize[(int)(u32)uStack_150] =
                       pFVar35->aTotalSize[(int)(u32)uStack_150] + (long)uStack_150._4_4_;
                  iVar8 = (u32)uStack_150 + 1;
                  uStack_150 = CONCAT44(uStack_150._4_4_,iVar8);
                  iVar12 = (int)local_b8.p;
                  if ((int)local_b8.p != 0) goto LAB_0019e0a5;
                }
                pFVar35->nTotalRow = pFVar35->nTotalRow + 1;
                iVar12 = fts5StorageInsertDocsize(pFVar35,(i64)local_148,&buf);
                local_b8.p = (u8 *)CONCAT44(local_b8.p._4_4_,iVar12);
                puVar21 = buf.p;
              } while (iVar12 == 0);
            }
            else {
              bVar41 = false;
              puVar21 = (u8 *)0x0;
            }
          }
          else {
            psVar37 = (sqlite3_stmt *)0x0;
            bVar41 = false;
            puVar21 = (u8 *)0x0;
          }
          sqlite3_free(puVar21);
          iVar8 = sqlite3_reset(psVar37);
          if (!bVar41) {
            iVar8 = iVar12;
          }
          if (iVar8 == 0) {
            iVar8 = fts5StorageSaveTotals(pFVar35);
          }
          goto LAB_0019e080;
        }
        pcVar14 = "\'rebuild\' may not be used with a contentless fts5 table";
      }
      fts5SetVtabError((Fts5FullTable *)pVtab,pcVar14);
      iVar8 = 1;
      goto LAB_0019e080;
    }
    psVar36 = apVal[(long)*(int *)&psVar28->xBestIndex + 3];
    local_124 = 0;
  }
LAB_0019db48:
  pFVar29 = *(Fts5Index **)&pVtab[1].nRef;
  pFVar16 = fts5StructureRead(pFVar29);
  fts5StructureRelease(pFVar16);
  iVar8 = pFVar29->rc;
  pFVar29->rc = 0;
  if (((iVar8 == 0) &&
      (iVar8 = sqlite3Fts5ConfigSetValue((Fts5Config *)pVtab[1].pModule,pcVar14,psVar36,&local_124),
      iVar8 == 0)) && (iVar8 = 1, local_124 == 0)) {
    iVar8 = sqlite3Fts5StorageConfigValue((Fts5Storage *)pVtab[1].zErrMsg,pcVar14,psVar36,0);
  }
LAB_0019e080:
  local_164 = iVar8;
  ((((Fts5FullTable *)pVtab)->p).pConfig)->pzErrmsg = (char **)0x0;
  return local_164;
code_r0x0019e2e3:
  plVar1 = pFVar35->aTotalSize + uVar24;
  lVar31 = uVar24 * 8;
  uVar24 = uVar24 + 1;
  if (*plVar1 != *(long *)((long)pvVar15 + lVar31)) goto LAB_0019dade;
  goto LAB_0019e2de;
}

Assistant:

static int fts5UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  Fts5Config *pConfig = pTab->p.pConfig;
  int eType0;                     /* value_type() of apVal[0] */
  int rc = SQLITE_OK;             /* Return code */

  /* A transaction must be open when this is called. */
  assert( pTab->ts.eState==1 );

  assert( pVtab->zErrMsg==0 );
  assert( nArg==1 || nArg==(2+pConfig->nCol+2) );
  assert( sqlite3_value_type(apVal[0])==SQLITE_INTEGER 
       || sqlite3_value_type(apVal[0])==SQLITE_NULL 
  );
  assert( pTab->p.pConfig->pzErrmsg==0 );
  pTab->p.pConfig->pzErrmsg = &pTab->p.base.zErrMsg;

  /* Put any active cursors into REQUIRE_SEEK state. */
  fts5TripCursors(pTab);

  eType0 = sqlite3_value_type(apVal[0]);
  if( eType0==SQLITE_NULL 
   && sqlite3_value_type(apVal[2+pConfig->nCol])!=SQLITE_NULL 
  ){
    /* A "special" INSERT op. These are handled separately. */
    const char *z = (const char*)sqlite3_value_text(apVal[2+pConfig->nCol]);
    if( pConfig->eContent!=FTS5_CONTENT_NORMAL 
      && 0==sqlite3_stricmp("delete", z) 
    ){
      rc = fts5SpecialDelete(pTab, apVal);
    }else{
      rc = fts5SpecialInsert(pTab, z, apVal[2 + pConfig->nCol + 1]);
    }
  }else{
    /* A regular INSERT, UPDATE or DELETE statement. The trick here is that
    ** any conflict on the rowid value must be detected before any 
    ** modifications are made to the database file. There are 4 cases:
    **
    **   1) DELETE
    **   2) UPDATE (rowid not modified)
    **   3) UPDATE (rowid modified)
    **   4) INSERT
    **
    ** Cases 3 and 4 may violate the rowid constraint.
    */
    int eConflict = SQLITE_ABORT;
    if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
      eConflict = sqlite3_vtab_on_conflict(pConfig->db);
    }

    assert( eType0==SQLITE_INTEGER || eType0==SQLITE_NULL );
    assert( nArg!=1 || eType0==SQLITE_INTEGER );

    /* Filter out attempts to run UPDATE or DELETE on contentless tables.
    ** This is not suported.  */
    if( eType0==SQLITE_INTEGER && fts5IsContentless(pTab) ){
      pTab->p.base.zErrMsg = sqlite3_mprintf(
          "cannot %s contentless fts5 table: %s", 
          (nArg>1 ? "UPDATE" : "DELETE from"), pConfig->zName
      );
      rc = SQLITE_ERROR;
    }

    /* DELETE */
    else if( nArg==1 ){
      i64 iDel = sqlite3_value_int64(apVal[0]);  /* Rowid to delete */
      rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, 0);
    }

    /* INSERT or UPDATE */
    else{
      int eType1 = sqlite3_value_numeric_type(apVal[1]);

      if( eType1!=SQLITE_INTEGER && eType1!=SQLITE_NULL ){
        rc = SQLITE_MISMATCH;
      }

      else if( eType0!=SQLITE_INTEGER ){     
        /* If this is a REPLACE, first remove the current entry (if any) */
        if( eConflict==SQLITE_REPLACE && eType1==SQLITE_INTEGER ){
          i64 iNew = sqlite3_value_int64(apVal[1]);  /* Rowid to delete */
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
        }
        fts5StorageInsert(&rc, pTab, apVal, pRowid);
      }

      /* UPDATE */
      else{
        i64 iOld = sqlite3_value_int64(apVal[0]);  /* Old rowid */
        i64 iNew = sqlite3_value_int64(apVal[1]);  /* New rowid */
        if( eType1==SQLITE_INTEGER && iOld!=iNew ){
          if( eConflict==SQLITE_REPLACE ){
            rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iNew, 0);
            }
            fts5StorageInsert(&rc, pTab, apVal, pRowid);
          }else{
            rc = sqlite3Fts5StorageContentInsert(pTab->pStorage, apVal, pRowid);
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
            }
            if( rc==SQLITE_OK ){
              rc = sqlite3Fts5StorageIndexInsert(pTab->pStorage, apVal,*pRowid);
            }
          }
        }else{
          rc = sqlite3Fts5StorageDelete(pTab->pStorage, iOld, 0);
          fts5StorageInsert(&rc, pTab, apVal, pRowid);
        }
      }
    }
  }

  pTab->p.pConfig->pzErrmsg = 0;
  return rc;
}